

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::rrb_details::rrb_drop_right<int,false,6>
          (rrb_details *this,ref<immutable::rrb<int,_false,_6>_> *in,uint32_t right)

{
  int *piVar1;
  leaf_node<int,_false> *__s;
  uint32_t uVar2;
  rrb<int,_false,_6> *prVar3;
  leaf_node<int,_false> *plVar4;
  long lVar5;
  tree_node<int,_false> *ptVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  undefined4 uVar9;
  rrb<int,_false,_6> *prVar10;
  uint32_t *puVar11;
  undefined8 *puVar12;
  char *__function;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ref<immutable::rrb_details::leaf_node<int,_false>_> new_tail;
  ref<immutable::rrb_details::tree_node<int,_false>_> root;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_50;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_48;
  uint32_t local_3c;
  rrb<int,_false,_6> *local_38;
  
  if (right == 0) {
    puVar12 = (undefined8 *)malloc(0x28);
    *puVar12 = 0;
    *(undefined4 *)(puVar12 + 1) = 0;
    puVar12[2] = 0;
    puVar12[3] = 0;
    local_50.ptr = (leaf_node<int,_false> *)malloc(0x18);
    (local_50.ptr)->type = LEAF_NODE;
    (local_50.ptr)->len = 0;
    (local_50.ptr)->child = (int *)0x0;
    (local_50.ptr)->guid = 0;
    (local_50.ptr)->_ref_count = 1;
    ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
              ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(puVar12 + 2),&local_50);
    if ((local_50.ptr != (leaf_node<int,_false> *)0x0) &&
       (uVar2 = (local_50.ptr)->_ref_count, (local_50.ptr)->_ref_count = uVar2 - 1, uVar2 == 1)) {
      free(local_50.ptr);
    }
    *(undefined8 **)this = puVar12;
    *(undefined4 *)(puVar12 + 4) = 1;
    return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
  }
  prVar3 = in->ptr;
  if (prVar3 != (rrb<int,_false,_6> *)0x0) {
    if (prVar3->cnt <= right) {
      *(rrb<int,_false,_6> **)this = prVar3;
      prVar3->_ref_count = prVar3->_ref_count + 1;
      return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
    }
    uVar14 = prVar3->cnt - prVar3->tail_len;
    uVar15 = right - uVar14;
    if (right < uVar14 || uVar15 == 0) {
      puVar12 = (undefined8 *)malloc(0x28);
      *puVar12 = 0;
      *(undefined4 *)(puVar12 + 1) = 0;
      puVar12[2] = 0;
      puVar12[3] = 0;
      local_50.ptr = (leaf_node<int,_false> *)malloc(0x18);
      (local_50.ptr)->type = LEAF_NODE;
      (local_50.ptr)->len = 0;
      (local_50.ptr)->child = (int *)0x0;
      (local_50.ptr)->guid = 0;
      (local_50.ptr)->_ref_count = 1;
      ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(puVar12 + 2),&local_50);
      if ((local_50.ptr != (leaf_node<int,_false> *)0x0) &&
         (uVar2 = (local_50.ptr)->_ref_count, (local_50.ptr)->_ref_count = uVar2 - 1, uVar2 == 1)) {
        free(local_50.ptr);
      }
      *(undefined8 **)this = puVar12;
      *(undefined4 *)(puVar12 + 4) = 1;
      prVar3 = in->ptr;
      if (prVar3 != (rrb<int,_false,_6> *)0x0) {
        rrb_drop_right_rec<int,false,6>
                  ((rrb_details *)&local_48,(uint32_t *)((long)puVar12 + 4),&prVar3->root,right - 1,
                   prVar3->shift,false);
        puVar11 = *(uint32_t **)this;
        if (puVar11 != (uint32_t *)0x0) {
          *puVar11 = right;
          if (local_48.ptr != (tree_node<int,_false> *)0x0) {
            (local_48.ptr)->_ref_count = (local_48.ptr)->_ref_count + 1;
          }
          local_50.ptr = *(leaf_node<int,_false> **)(puVar11 + 6);
          *(tree_node<int,_false> **)(puVar11 + 6) = local_48.ptr;
          ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                    ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_50);
          promote_rightmost_leaf<int,false,6>((ref<immutable::rrb<int,_false,_6>_> *)this);
          lVar5 = *(long *)this;
          if (lVar5 != 0) {
            if (*(long *)(lVar5 + 0x10) != 0) {
              *(undefined4 *)(lVar5 + 8) = *(undefined4 *)(*(long *)(lVar5 + 0x10) + 4);
              ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_48);
              return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
            }
            goto LAB_0014d333;
          }
        }
      }
    }
    else {
      puVar11 = (uint32_t *)malloc(0x28);
      uVar2 = prVar3->cnt;
      uVar7 = prVar3->shift;
      uVar8 = prVar3->tail_len;
      uVar9 = *(undefined4 *)&prVar3->field_0xc;
      ptVar6 = (prVar3->root).ptr;
      *(leaf_node<int,_false> **)(puVar11 + 4) = (prVar3->tail).ptr;
      *(tree_node<int,_false> **)(puVar11 + 6) = ptVar6;
      puVar11[0] = uVar2;
      puVar11[1] = uVar7;
      puVar11[2] = uVar8;
      puVar11[3] = uVar9;
      uVar9 = *(undefined4 *)&prVar3->field_0x24;
      puVar11[8] = prVar3->_ref_count;
      puVar11[9] = uVar9;
      if (*(long *)(puVar11 + 6) != 0) {
        piVar1 = (int *)(*(long *)(puVar11 + 6) + 8);
        *piVar1 = *piVar1 + 1;
      }
      if (*(long *)(puVar11 + 4) != 0) {
        piVar1 = (int *)(*(long *)(puVar11 + 4) + 8);
        *piVar1 = *piVar1 + 1;
      }
      *(uint32_t **)this = puVar11;
      if (puVar11 != (uint32_t *)0x0) {
        puVar11[8] = 1;
      }
      local_38 = (rrb<int,_false,_6> *)this;
      local_50.ptr = (leaf_node<int,_false> *)malloc((ulong)uVar15 * 4 + 0x18);
      __s = local_50.ptr + 1;
      local_3c = right - uVar14;
      (local_50.ptr)->len = local_3c;
      (local_50.ptr)->type = LEAF_NODE;
      (local_50.ptr)->child = (int *)__s;
      (local_50.ptr)->guid = 0;
      if (local_3c != 0) {
        memset(__s,0,(ulong)uVar15 << 2);
      }
      prVar10 = local_38;
      uVar2 = local_3c;
      (local_50.ptr)->_ref_count = 1;
      if (right != uVar14) {
        plVar4 = (prVar3->tail).ptr;
        if (plVar4 == (leaf_node<int,_false> *)0x0) {
LAB_0014d333:
          __function = 
          "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
          ;
          goto LAB_0014d329;
        }
        piVar1 = plVar4->child;
        uVar13 = 0;
        do {
          (&__s->type)[uVar13] = piVar1[uVar13];
          uVar13 = uVar13 + 1;
        } while (local_3c + (local_3c == 0) != uVar13);
      }
      if (puVar11 != (uint32_t *)0x0) {
        *puVar11 = right;
        ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(puVar11 + 4),&local_50);
        lVar5 = *(long *)prVar10;
        if (lVar5 != 0) {
          *(uint32_t *)(lVar5 + 8) = uVar2;
          if ((local_50.ptr != (leaf_node<int,_false> *)0x0) &&
             (uVar2 = (local_50.ptr)->_ref_count, (local_50.ptr)->_ref_count = uVar2 - 1, uVar2 == 1
             )) {
            free(local_50.ptr);
          }
          return (ref<immutable::rrb<int,_false,_6>_>)prVar10;
        }
      }
    }
  }
  __function = 
  "T *immutable::ref<immutable::rrb<int, false, 6>>::operator->() const [T = immutable::rrb<int, false, 6>]"
  ;
LAB_0014d329:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_drop_right(ref<rrb<T, atomic_ref_counting, N>> in, const uint32_t right)
      {
      using namespace rrb_details;
      if (right == 0)
        {
        return rrb_create<T, atomic_ref_counting, N>();
        }
      else if (right < in->cnt)
        {
        const uint32_t tail_offset = in->cnt - in->tail_len;
        // Can just cut the tail slightly
        if (tail_offset < right)
          {
          ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_head_clone(in.ptr);
          const uint32_t new_tail_len = right - tail_offset;
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_create<T, atomic_ref_counting>(new_tail_len);
          //memcpy(new_tail->child, in->tail->child, new_tail_len * sizeof(T));
          for (uint32_t i = 0; i < new_tail_len; ++i)
            new_tail->child[i] = in->tail->child[i]; // don't memcpy, but use copy constructor

          new_rrb->cnt = right;
          new_rrb->tail = new_tail;
          new_rrb->tail_len = new_tail_len;
          return new_rrb;
          }

        ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_create<T, atomic_ref_counting, N>();
        ref<tree_node<T, atomic_ref_counting>> root = rrb_drop_right_rec<T, atomic_ref_counting, N>(&new_rrb->shift, in->root, right - 1, in->shift, false);
        new_rrb->cnt = right;
        new_rrb->root = root;

        // Not sure if this is necessary in this part of the program, due to issues
        // wrt. rrb_drop_left and roots without size tables.
        promote_rightmost_leaf(new_rrb);
        new_rrb->tail_len = new_rrb->tail->len;
        return new_rrb;
        }
      else
        {
        return in;
        }
      }